

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scope.cpp
# Opt level: O0

Scope * __thiscall Scope::SortAndUnique(Scope *this)

{
  bool bVar1;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  *p_Var2;
  iterator __position;
  reference puVar3;
  Scope *in_RDI;
  iterator it;
  iterator prev;
  undefined4 in_stack_ffffffffffffffb8;
  uint in_stack_ffffffffffffffbc;
  Scope *in_stack_ffffffffffffffd0;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_20;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_18;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_10 [2];
  
  Sort(in_stack_ffffffffffffffd0);
  local_10[0]._M_current =
       (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                          CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  local_20._M_current =
       (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                          CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  p_Var2 = __gnu_cxx::
           __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
           ::operator++(&local_20);
  local_18._M_current = p_Var2->_M_current;
  while( true ) {
    __position = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                            CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                        *)in_RDI,
                       (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                        *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    if (!bVar1) break;
    puVar3 = __gnu_cxx::
             __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
             ::operator*(&local_18);
    in_stack_ffffffffffffffbc = *puVar3;
    puVar3 = __gnu_cxx::
             __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
             ::operator*(local_10);
    if (in_stack_ffffffffffffffbc == *puVar3) {
      __gnu_cxx::
      __normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>
      ::__normal_iterator<unsigned_int*>
                ((__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                  *)in_RDI,
                 (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                  *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::erase
                (&in_stack_ffffffffffffffd0->super_SDT,(const_iterator)__position._M_current);
    }
    else {
      local_10[0]._M_current = local_18._M_current;
      __gnu_cxx::
      __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
      operator++(&local_18);
    }
  }
  return in_RDI;
}

Assistant:

Scope& Scope::SortAndUnique()
{
    Sort();
    SDT::iterator prev=begin();
    for (SDT::iterator it=++begin();it!=end();)
    {
        if (*it==*prev)
            erase(it);
        else
        {
            prev=it;
            ++it;
        }
    }
    return *this;
}